

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

TrackData *
GeneratePrehistorikTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  undefined8 this;
  bool bVar1;
  int iVar2;
  int gap3_bytes;
  reference this_00;
  Data *data;
  BitBuffer *bitstream;
  Sector *sector;
  const_iterator __end1;
  const_iterator __begin1;
  Track *__range1;
  int gap3;
  undefined1 local_a0 [8];
  BitstreamTrackBuilder bitbuf;
  Track *track_local;
  CylHead *cylhead_local;
  
  bitbuf.m_buffer._96_8_ = track;
  bVar1 = IsPrehistorikTrack(track);
  if (!bVar1) {
    __assert_fail("IsPrehistorikTrack(track)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                  ,0x2e6,"TrackData GeneratePrehistorikTrack(const CylHead &, const Track &)");
  }
  BitstreamTrackBuilder::BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0,_250K,MFM);
  TrackBuilder::addTrackStart((TrackBuilder *)local_a0,false);
  iVar2 = Track::size((Track *)bitbuf.m_buffer._96_8_);
  this = bitbuf.m_buffer._96_8_;
  gap3_bytes = 0x1e;
  if (iVar2 == 0xb) {
    gap3_bytes = 0x6a;
  }
  __end1 = Track::begin((Track *)bitbuf.m_buffer._96_8_);
  sector = (Sector *)Track::end((Track *)this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                *)&sector);
    if (!bVar1) {
LAB_00232596:
      bitstream = BitstreamTrackBuilder::buffer((BitstreamTrackBuilder *)local_a0);
      TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
      BitstreamTrackBuilder::~BitstreamTrackBuilder((BitstreamTrackBuilder *)local_a0);
      return __return_storage_ptr__;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
              operator*(&__end1);
    if ((this_00->header).sector == 0xc) {
      data = Sector::data_copy(this_00,0);
      TrackBuilder::addSector
                ((TrackBuilder *)local_a0,&this_00->header,data,gap3_bytes,this_00->dam,true);
      goto LAB_00232596;
    }
    TrackBuilder::addSector((TrackBuilder *)local_a0,this_00,gap3_bytes);
    __gnu_cxx::__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

TrackData GeneratePrehistorikTrack(const CylHead& cylhead, const Track& track)
{
    assert(IsPrehistorikTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart();

    auto gap3 = (track.size() == 11) ? 106 : 30;
    for (auto& sector : track)
    {
        if (sector.header.sector != 12)
            bitbuf.addSector(sector, gap3);
        else
        {
            bitbuf.addSector(sector.header, sector.data_copy(), gap3, sector.dam, true);
            break;
        }
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}